

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_inv_txfm2d_add_h_identity_ssse41
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  undefined8 uVar8;
  longlong lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  byte in_CL;
  long lVar17;
  long lVar18;
  long lVar19;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int i_2;
  int i_1;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i *buf0_cur;
  int j;
  __m128i *_buf1;
  __m128i buf0 [16];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_sse4_1 col_txfm;
  transform_1d_sse4_1 row_txfm;
  int fun_idx;
  int rect_type;
  int input_stride;
  int row_max;
  int buf_size_h_div8;
  int buf_size_w_div4;
  int buf_size_w;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m128i buf1 [64];
  int local_6f8;
  int local_6f4;
  int in_stack_fffffffffffff910;
  int iVar20;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  int in_stack_fffffffffffff950;
  int in_stack_fffffffffffff954;
  uint16_t *in_stack_fffffffffffff958;
  __m128i *in_stack_fffffffffffff960;
  int local_694;
  int in_stack_fffffffffffff97c;
  int in_stack_fffffffffffff980;
  int in_stack_fffffffffffff984;
  __m128i *in_stack_fffffffffffff988;
  __m128i *in_stack_fffffffffffff990;
  longlong alStack_668 [3];
  undefined8 uStack_650;
  int local_584;
  int local_580;
  int local_57c;
  transform_1d_sse4_1 local_578;
  transform_1d_sse4_1 local_570;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  char *local_538;
  int local_530;
  int local_52c;
  longlong local_528 [129];
  byte local_11e;
  byte local_11d;
  long local_110;
  longlong local_108;
  undefined8 uStack_100;
  longlong local_f8;
  undefined8 uStack_f0;
  longlong local_e8;
  undefined8 uStack_e0;
  longlong local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  longlong lStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  longlong lStack_90;
  longlong local_88;
  undefined8 uStack_80;
  longlong local_78;
  undefined8 uStack_70;
  longlong local_68;
  undefined8 uStack_60;
  longlong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  int iStack_14;
  undefined8 uStack_10;
  
  local_11e = in_R8B;
  local_11d = in_CL;
  local_110 = in_RDI;
  get_eobx_eoby_scan_v_identity(&local_52c,&local_530,in_R8B,in_R9D);
  local_538 = av1_inv_txfm_shift_ls[local_11e];
  local_53c = get_txw_idx(local_11e);
  local_540 = get_txh_idx(local_11e);
  local_544 = tx_size_wide[local_11e];
  local_548 = tx_size_high[local_11e];
  local_6f4 = local_544;
  if (0x20 < local_544) {
    local_6f4 = 0x20;
  }
  local_54c = local_6f4;
  local_550 = local_6f4 >> 2;
  local_554 = local_530 + 8 >> 3;
  local_6f8 = local_548;
  if (0x20 < local_548) {
    local_6f8 = 0x20;
  }
  local_558 = local_6f8;
  local_55c = local_6f8;
  local_560 = get_rect_tx_log_ratio(local_544,local_548);
  local_564 = lowbd_txfm_all_1d_zeros_idx[local_530];
  local_570 = highbd_txfm_all_1d_zeros_w8_arr[local_53c][""[local_11d]][0];
  local_578 = highbd_txfm_all_1d_zeros_w8_arr[local_540][""[local_11d]][local_564];
  get_flip_cfg(local_11d,&local_57c,&local_580);
  for (local_584 = 0; SBORROW4(local_584,local_554 * 2) != local_584 + local_554 * -2 < 0;
      local_584 = local_584 + 1) {
    load_buffer_32bit_input
              ((int32_t *)(local_110 + (long)(local_584 << 2) * 4),local_55c,
               (__m128i *)&stack0xfffffffffffff978,local_54c);
    if ((local_560 == 1) || (local_560 == -1)) {
      av1_round_shift_rect_array_32_sse4_1
                (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff984,
                 in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
    }
    (*local_570)((__m128i *)&stack0xfffffffffffff978,(__m128i *)&stack0xfffffffffffff978,0xc,0,i_2,
                 -(int)*local_538);
    lVar17 = (long)(local_584 << 2);
    for (local_694 = 0; local_694 < local_550; local_694 = local_694 + 1) {
      lVar18 = (long)(local_694 << 2);
      lVar19 = lVar18 * 0x10;
      in_stack_fffffffffffff960 = (__m128i *)(&stack0xfffffffffffff978 + lVar19);
      lVar1 = (*in_stack_fffffffffffff960)[0];
      lStack_90 = alStack_668[lVar18 * 2 + -3];
      lVar2 = alStack_668[lVar18 * 2 + -2];
      uStack_a0 = *(undefined8 *)(&stack0xfffffffffffff990 + lVar19);
      local_98._0_4_ = (int)lVar1;
      in_stack_fffffffffffff948 = (int)local_98;
      local_98._4_4_ = (int)((ulong)lVar1 >> 0x20);
      in_stack_fffffffffffff950 = local_98._4_4_;
      local_a8._0_4_ = (int)lVar2;
      in_stack_fffffffffffff94c = (int)local_a8;
      local_a8._4_4_ = (int)((ulong)lVar2 >> 0x20);
      in_stack_fffffffffffff954 = local_a8._4_4_;
      local_58 = (*in_stack_fffffffffffff960)[0];
      lVar3 = alStack_668[lVar18 * 2 + -3];
      local_68 = alStack_668[lVar18 * 2 + -2];
      uVar4 = *(undefined8 *)(&stack0xfffffffffffff990 + lVar19);
      uStack_50._0_4_ = (undefined4)lVar3;
      uVar15 = (undefined4)uStack_50;
      uStack_50._4_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      uVar16 = uStack_50._4_4_;
      uStack_60._0_4_ = (undefined4)uVar4;
      uVar13 = (undefined4)uStack_60;
      uStack_60._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      uVar14 = uStack_60._4_4_;
      lVar5 = alStack_668[lVar18 * 2];
      lStack_b0 = alStack_668[lVar18 * 2 + 1];
      lVar6 = alStack_668[lVar18 * 2 + 2];
      uStack_c0 = *(undefined8 *)((long)&uStack_650 + lVar18 * 0x10);
      local_b8._0_4_ = (undefined4)lVar5;
      uVar12 = (undefined4)local_b8;
      local_b8._4_4_ = (undefined4)((ulong)lVar5 >> 0x20);
      local_c8._0_4_ = (undefined4)lVar6;
      uVar10 = (undefined4)local_c8;
      local_c8._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
      uVar11 = local_c8._4_4_;
      local_78 = alStack_668[lVar18 * 2];
      lVar7 = alStack_668[lVar18 * 2 + 1];
      local_88 = alStack_668[lVar18 * 2 + 2];
      uVar8 = *(undefined8 *)((long)&uStack_650 + lVar18 * 0x10);
      uStack_70._0_4_ = (undefined4)lVar7;
      in_stack_fffffffffffff918 = (undefined4)uStack_70;
      uStack_70._4_4_ = (undefined4)((ulong)lVar7 >> 0x20);
      in_stack_fffffffffffff920 = uStack_70._4_4_;
      uStack_80._0_4_ = (undefined4)uVar8;
      in_stack_fffffffffffff91c = (undefined4)uStack_80;
      uStack_80._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
      in_stack_fffffffffffff924 = uStack_80._4_4_;
      local_d8 = CONCAT44((int)local_a8,(int)local_98);
      uStack_d0 = CONCAT44(local_a8._4_4_,local_98._4_4_);
      lVar9 = CONCAT44((undefined4)local_c8,(undefined4)local_b8);
      uStack_e0 = CONCAT44(local_c8._4_4_,local_b8._4_4_);
      local_e8 = lVar9;
      local_c8 = lVar6;
      local_b8 = lVar5;
      local_a8 = lVar2;
      local_98 = lVar1;
      uStack_80 = uVar8;
      uStack_70 = lVar7;
      uStack_60 = uVar4;
      uStack_50 = lVar3;
      (*in_stack_fffffffffffff960)[0] = local_d8;
      alStack_668[lVar18 * 2 + -3] = lVar9;
      uStack_10 = CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950);
      local_28 = CONCAT44(uVar10,uVar12);
      uStack_1c = uVar11;
      _local_18 = CONCAT44(in_stack_fffffffffffff94c,uVar15);
      uVar4 = CONCAT44(uVar11,uStack_20);
      *(int *)(&stack0xfffffffffffff990 + lVar19) = in_stack_fffffffffffff950;
      *(int *)(&stack0xfffffffffffff994 + lVar19) = in_stack_fffffffffffff954;
      *(undefined8 *)(&stack0xfffffffffffff990 + lVar19) = uVar4;
      local_f8 = CONCAT44(uVar13,uVar15);
      uStack_f0 = CONCAT44(uVar14,uVar16);
      uStack_100 = CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920);
      local_108 = CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918);
      alStack_668[lVar18 * 2] = local_f8;
      alStack_668[lVar18 * 2 + 1] = CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918);
      uStack_30 = CONCAT44(uVar14,uVar16);
      local_48 = CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918);
      uStack_3c = in_stack_fffffffffffff924;
      _local_38 = CONCAT44(uVar13,uVar12);
      uVar4 = CONCAT44(in_stack_fffffffffffff924,uStack_40);
      *(undefined4 *)((long)&uStack_650 + lVar18 * 0x10) = uVar16;
      *(undefined4 *)((long)&uStack_650 + lVar18 * 0x10U + 4U) = uVar14;
      *(undefined8 *)((long)&uStack_650 + lVar18 * 0x10) = uVar4;
      lVar1 = alStack_668[lVar18 * 2 + -3];
      local_528[lVar17 * 2 + (long)(local_694 * local_548) * 2] = (*in_stack_fffffffffffff960)[0];
      (local_528 + lVar17 * 2 + (long)(local_694 * local_548) * 2)[1] = lVar1;
      lVar1 = *(longlong *)(&stack0xfffffffffffff990 + lVar19);
      local_528[lVar17 * 2 + (long)(local_694 * local_548 + 1) * 2] = alStack_668[lVar18 * 2 + -2];
      (local_528 + lVar17 * 2 + (long)(local_694 * local_548 + 1) * 2)[1] = lVar1;
      lVar1 = alStack_668[lVar18 * 2 + 1];
      local_528[lVar17 * 2 + (long)(local_694 * local_548 + 2) * 2] = alStack_668[lVar18 * 2];
      (local_528 + lVar17 * 2 + (long)(local_694 * local_548 + 2) * 2)[1] = lVar1;
      lVar1 = *(longlong *)((long)&uStack_650 + lVar18 * 0x10);
      local_528[lVar17 * 2 + (long)(local_694 * local_548 + 3) * 2] = alStack_668[lVar18 * 2 + 2];
      (local_528 + lVar17 * 2 + (long)(local_694 * local_548 + 3) * 2)[1] = lVar1;
    }
  }
  for (iVar20 = 0; iVar20 < local_550; iVar20 = iVar20 + 1) {
    (*local_578)((__m128i *)(local_528 + (long)(iVar20 * local_548) * 2),
                 (__m128i *)(local_528 + (long)(iVar20 * local_548) * 2),0xc,1,i_2,0);
    av1_round_shift_array_32_sse4_1
              ((__m128i *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (__m128i *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),iVar20,
               in_stack_fffffffffffff910);
  }
  for (iVar20 = 0; iVar20 < local_544 >> 3; iVar20 = iVar20 + 1) {
    highbd_write_buffer_8xn_sse4_1
              (in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff954,
               in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948);
  }
  return;
}

Assistant:

static void highbd_inv_txfm2d_add_h_identity_ssse41(const int32_t *input,
                                                    uint16_t *output,
                                                    int stride, TX_TYPE tx_type,
                                                    TX_SIZE tx_size, int eob,
                                                    const int bd) {
  __m128i buf1[64];
  int eobx, eoby;
  get_eobx_eoby_scan_v_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w = AOMMIN(32, txfm_size_col);
  const int buf_size_w_div4 = buf_size_w >> 2;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int row_max = AOMMIN(32, txfm_size_row);
  const int input_stride = row_max;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_sse4_1 row_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][0];
  const transform_1d_sse4_1 col_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < (buf_size_h_div8 << 1); ++i) {
    __m128i buf0[16];
    load_buffer_32bit_input(input + i * 4, input_stride, buf0, buf_size_w);
    if (rect_type == 1 || rect_type == -1) {
      av1_round_shift_rect_array_32_sse4_1(buf0, buf0, buf_size_w, 0,
                                           NewInvSqrt2);
    }
    row_txfm(buf0, buf0, INV_COS_BIT, 0, bd, -shift[0]);

    __m128i *_buf1 = buf1 + i * 4;

    for (int j = 0; j < buf_size_w_div4; ++j) {
      __m128i *buf0_cur = buf0 + j * 4;
      TRANSPOSE_4X4(buf0_cur[0], buf0_cur[1], buf0_cur[2], buf0_cur[3],
                    buf0_cur[0], buf0_cur[1], buf0_cur[2], buf0_cur[3]);
      _buf1[j * txfm_size_row + 0] = buf0_cur[0];
      _buf1[j * txfm_size_row + 1] = buf0_cur[1];
      _buf1[j * txfm_size_row + 2] = buf0_cur[2];
      _buf1[j * txfm_size_row + 3] = buf0_cur[3];
    }
  }
  for (int i = 0; i < buf_size_w_div4; i++) {
    col_txfm(buf1 + i * txfm_size_row, buf1 + i * txfm_size_row, INV_COS_BIT, 1,
             bd, 0);

    av1_round_shift_array_32_sse4_1(buf1 + i * txfm_size_row,
                                    buf1 + i * txfm_size_row, txfm_size_row,
                                    -shift[1]);
  }

  // write to buffer
  for (int i = 0; i < (txfm_size_col >> 3); i++) {
    highbd_write_buffer_8xn_sse4_1(buf1 + i * txfm_size_row * 2, output + 8 * i,
                                   stride, ud_flip, txfm_size_row, bd);
  }
}